

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog>::
LineStripRenderer(LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog>
                  *this,GetterYs<unsigned_char> *getter,TransformerLinLog *transformer,ImU32 col,
                 float weight)

{
  ImVec2 IVar1;
  ImPlotPoint local_20;
  
  this->Getter = getter;
  this->Transformer = transformer;
  this->Prims = getter->Count + -1;
  this->Col = col;
  this->Weight = weight;
  (this->P1).x = 0.0;
  (this->P1).y = 0.0;
  local_20 = GetterYs<unsigned_char>::operator()(getter,0);
  IVar1 = TransformerLinLog::operator()(transformer,&local_20);
  this->P1 = IVar1;
  return;
}

Assistant:

inline LineStripRenderer(const TGetter& getter, const TTransformer& transformer, ImU32 col, float weight) :
        Getter(getter),
        Transformer(transformer),
        Prims(Getter.Count - 1),
        Col(col),
        Weight(weight)
    {
        P1 = Transformer(Getter(0));
    }